

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_and_handles.h
# Opt level: O0

undefined8 Uint32ToHexString_abi_cxx11_(uint32_t val)

{
  undefined4 in_register_0000003c;
  uint32_t val_local;
  
  to_hex<unsigned_int>((uint *)CONCAT44(in_register_0000003c,val));
  return CONCAT44(in_register_0000003c,val);
}

Assistant:

inline std::string Uint32ToHexString(uint32_t val) { return to_hex(val); }